

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

void __thiscall
dlib::drawable_window::on_keydown
          (drawable_window *this,unsigned_long key,bool is_printable,unsigned_long state)

{
  unsigned_long uVar1;
  bool bVar2;
  T *ppdVar3;
  undefined8 in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_000001f0;
  
  *(long *)(in_RDI + 0x548) = *(long *)(in_RDI + 0x548) + 1;
  set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::reset((set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *)0x498b23);
  while (bVar2 = set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::move_next((set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                              *)0x498b34), bVar2) {
    ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
              ::element(in_stack_000001f0);
    if ((*ppdVar3)->event_id != *(unsigned_long *)(in_RDI + 0x548)) {
      uVar1 = *(unsigned_long *)(in_RDI + 0x548);
      ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                ::element(in_stack_000001f0);
      (*ppdVar3)->event_id = uVar1;
      ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                ::element(in_stack_000001f0);
      (*(*ppdVar3)->_vptr_drawable[0x17])(*ppdVar3,in_RSI,(ulong)(in_DL & 1),in_RCX);
    }
  }
  return;
}

Assistant:

void drawable_window::
    on_keydown (
        unsigned long key,
        bool is_printable,
        unsigned long state
    )
    {
        ++event_id;
        keyboard.reset();
        while (keyboard.move_next())
        {
            if (keyboard.element()->event_id != event_id)
            {
                keyboard.element()->event_id = event_id;
                keyboard.element()->on_keydown(key,is_printable,state);
            }
        }
    }